

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHandler.hpp
# Opt level: O2

void __thiscall DataHandler::~DataHandler(DataHandler *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~DataHandler()
	{
	}